

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O1

unsigned_long __thiscall
CVmObjStrComp::match_strings
          (CVmObjStrComp *this,char *valstr,size_t vallen,char *refstr,size_t reflen)

{
  size_t *psVar1;
  long lVar2;
  wchar_t ch;
  wchar_t wVar3;
  int iVar4;
  uint uVar5;
  wchar_t *pwVar6;
  size_t sVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  long *plVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  utf8_ptr valp;
  utf8_ptr refp;
  size_t vlen;
  wchar_t *vp;
  utf8_ptr local_68;
  byte *local_60;
  long *local_58;
  utf8_ptr local_50;
  byte *local_48;
  size_t local_40;
  wchar_t *local_38;
  
  plVar11 = (long *)(this->super_CVmObject).ext_;
  lVar2 = plVar11[1];
  uVar13 = 0;
  local_68.p_ = valstr;
  local_60 = (byte *)vallen;
  local_58 = plVar11;
  local_50.p_ = refstr;
  local_48 = (byte *)reflen;
  do {
    if ((local_60 == (byte *)0x0) || (local_48 == (byte *)0x0)) {
      if (local_48 == (byte *)0x0 && local_60 == (byte *)0x0) {
        return uVar13 | 1;
      }
      if (local_60 != (byte *)0x0) {
        return 0;
      }
      uVar12 = 0;
      if (local_68.p_ != valstr && -1 < (long)local_68.p_ - (long)valstr) {
        do {
          valstr = (char *)((byte *)valstr +
                           (ulong)((((byte)*valstr >> 5 & 1) != 0) + 1 &
                                  (uint)((byte)*valstr >> 7) * 3) + 1);
          uVar12 = uVar12 + 1;
        } while (valstr < local_68.p_);
      }
      if (*plVar11 - 1U < uVar12) {
        return uVar13 | 5;
      }
      return 0;
    }
    ch = utf8_ptr::s_getch(local_68.p_);
    wVar3 = utf8_ptr::s_getch(local_50.p_);
    if (wVar3 == ch) {
      local_60 = (byte *)(local_68.p_ +
                         ((long)local_60 -
                         (long)(local_68.p_ +
                               (ulong)((((byte)*local_68.p_ >> 5 & 1) != 0) + 1 &
                                      (uint)((byte)*local_68.p_ >> 7) * 3) + 1)));
      local_68.p_ = local_68.p_ +
                    (ulong)((((byte)*local_68.p_ >> 5 & 1) != 0) + 1 &
                           (uint)((byte)*local_68.p_ >> 7) * 3) + 1;
LAB_002bbc7e:
      local_48 = (byte *)(local_50.p_ +
                         ((long)local_48 -
                         (long)(local_50.p_ +
                               (ulong)((((byte)*local_50.p_ >> 5 & 1) != 0) + 1 &
                                      (uint)((byte)*local_50.p_ >> 7) * 3) + 1)));
      local_50.p_ = local_50.p_ +
                    (ulong)((((byte)*local_50.p_ >> 5 & 1) != 0) + 1 &
                           (uint)((byte)*local_50.p_ >> 7) * 3) + 1;
LAB_002bbcb4:
      bVar14 = true;
    }
    else {
      if (((int)lVar2 == 0) &&
         (iVar4 = t3_compare_case_fold_min
                            (&local_68,(size_t *)&local_60,&local_50,(size_t *)&local_48),
         iVar4 == 0)) {
        uVar13 = uVar13 | 2;
        goto LAB_002bbcb4;
      }
      if ((plVar11[(ulong)((uint)wVar3 >> 8 & 0xff) + 2] != 0) &&
         (psVar1 = *(size_t **)
                    (plVar11[(ulong)((uint)wVar3 >> 8 & 0xff) + 2] + (ulong)(uint)(wVar3 & 0xff) * 8
                    ), psVar1 != (size_t *)0x0)) {
        uVar5 = t3_get_chartype(ch);
        uVar12 = uVar13 | psVar1[(ulong)((uVar5 & 0xfffffffe) != 2) + 2];
        local_38 = (wchar_t *)psVar1[1];
        local_40 = *psVar1;
        bVar14 = local_40 != 0;
        uVar13 = uVar12;
        if ((local_60 != (byte *)0x0) && (local_40 != 0)) {
          uVar10 = uVar12 | 2;
          uVar8 = uVar12;
          do {
            while( true ) {
              sVar7 = local_40 - 1;
              pwVar6 = local_38 + 1;
              uVar13 = uVar8;
              if (*local_38 != ch) break;
              pbVar9 = (byte *)(local_68.p_ +
                               (ulong)((((byte)*local_68.p_ >> 5 & 1) != 0) + 1 &
                                      (uint)((byte)*local_68.p_ >> 7) * 3) + 1);
              bVar14 = sVar7 != 0;
              local_60 = (byte *)(local_68.p_ + ((long)local_60 - (long)pbVar9));
              plVar11 = local_58;
              local_68.p_ = (char *)pbVar9;
              local_40 = sVar7;
              local_38 = pwVar6;
              if ((local_60 == (byte *)0x0) || (!bVar14)) goto LAB_002bbe13;
            }
            uVar13 = uVar12;
            if (((int)lVar2 != 0) ||
               (iVar4 = t3_compare_case_fold_min(&local_68,(size_t *)&local_60,&local_38,&local_40),
               uVar13 = uVar8, iVar4 != 0)) {
              bVar14 = false;
              plVar11 = local_58;
              goto LAB_002bbe1e;
            }
            bVar14 = local_40 != 0;
            plVar11 = local_58;
            uVar13 = uVar10;
          } while ((local_60 != (byte *)0x0) && (uVar8 = uVar10, local_40 != 0));
        }
LAB_002bbe13:
        if (!bVar14) goto LAB_002bbc7e;
      }
      bVar14 = false;
    }
LAB_002bbe1e:
    if (!bVar14) {
      return 0;
    }
  } while( true );
}

Assistant:

unsigned long CVmObjStrComp::match_strings(const char *valstr, size_t vallen,
                                           const char *refstr, size_t reflen)
{
    vmobj_strcmp_ext *ext = get_ext();
    utf8_ptr valp;
    utf8_ptr refp;
    unsigned long ret;
    int fold_case = !(ext->case_sensitive);

    /* set up to scan the strings */
    valp.set((char *)valstr);
    refp.set((char *)refstr);

    /* start with no return flags */
    ret = 0;

    /* scan the strings */
    while (vallen != 0 && reflen != 0)
    {
        /* get each character */
        wchar_t valch = valp.getch();
        wchar_t refch = refp.getch();

        /* check for an exact match first */
        if (refch == valch)
        {
            /* it's an exact match - skip this character in each string */
            valp.inc(&vallen);
            refp.inc(&reflen);
            continue;
        }

        /* check for a case-folded match if we're insensitive to case */
        if (fold_case
            && t3_compare_case_fold_min(valp, vallen, refp, reflen) == 0)
        {
            /* note in the flags that we have differing cases in the match */
            ret |= RF_CASEFOLD;

            /* keep going */
            continue;
        }

        /* check for a reference equivalence mapping */
        vmobj_strcmp_equiv **t1;
        vmobj_strcmp_equiv *eq;
        if ((t1 = ext->equiv[(refch >> 8) & 0xFF]) != 0
            && (eq = t1[refch & 0xFF]) != 0)
        {
            /* 
             *   In case we match, apply the appropriate flags added for the
             *   equivalence mapping, based on the case of the first value
             *   character we're testing.  (If we don't match, we'll simply
             *   return failure, so it won't matter that we messed with the
             *   flags.)  
             */
            ret |= (t3_is_upper(valch)
                    ? eq->uc_result_flags
                    : eq->lc_result_flags);

            /* match each character from the mapping string */
            const wchar_t *vp;
            size_t vlen;
            for (vp = eq->val_ch, vlen = eq->val_ch_cnt ;
                 vallen != 0 && vlen != 0 ; )
            {
                /* get this character */
                refch = *vp;
                
                /* if we have an exact match, keep going */
                if (refch == valch)
                {
                    /* matched - skip this character in each string */
                    valp.inc(&vallen);
                    ++vp, --vlen;

                    /* keep going */
                    continue;
                }

                /* check for a case-folded match if appropriate */
                if (fold_case
                    && t3_compare_case_fold_min(valp, vallen, vp, vlen) == 0)
                {
                    /* note the case-folded match and keep going */
                    ret |= RF_CASEFOLD;
                    continue;
                }

                /* no match */
                return 0;
            }

            /* 
             *   if we didn't make it to the end of the equivalence string,
             *   we must have run out of source before we matched the whole
             *   string, so we don'to have a match 
             */
            if (vlen != 0)
                return 0;

            /* 
             *   If we make it here, we matched the equivalence mapping.
             *   We've already skipped the input we matched, so skip the
             *   reference character and keep going.  
             */
            refp.inc(&reflen);
            continue;
        }

        /* we don't have anything else to try, so we don't have a match */
        return 0;
    }

    /* 
     *   If we ran out of reference string before we ran out of value
     *   string, we definitely do not have a match.  If we ran out of value
     *   string before we ran out reference string, we have a match as long
     *   as we matched at least the truncation length. 
     */
    if (reflen == 0 && vallen == 0)
    {
        /* 
         *   We ran out of both at the same time - it's a match.  Return the
         *   result code up to this point OR'd with RF_MATCH, which is our
         *   pre-defined bit that we set for every match.  
         */
        return (ret | RF_MATCH);
    }
    else if (vallen != 0)
    {
        /* we ran out of reference string first - it's not a match */
        return 0;
    }
    else
    {
        /* 
         *   We ran out of value string first, so it's a truncated match if
         *   we matched at least up to the truncation length (assuming we
         *   allow truncation at all).  If we didn't make it to the
         *   truncation length, or we don't allow truncation, it's not a
         *   match. 
         */
        size_t valcharlen = utf8_ptr::s_len(valstr, valp.getptr() - valstr);
        if (ext->trunc_len != 0 && valcharlen >= ext->trunc_len)
        {
            /* 
             *   it's a truncated match - return the result code up to this
             *   point, OR'd with RF_MATCH (our pre-defined bit we set for
             *   every match) and RF_TRUNC (our pre-defined bit we set for
             *   truncated matches) 
             */
            return (ret | RF_MATCH | RF_TRUNC);
        }
        else
        {
            /* didn't make it to the truncation length, so it's not a match */
            return 0;
        }
    }
}